

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
kj::ArrayPtr<unsigned_char>::copyFrom
          (ArrayPtr<unsigned_char> *this,ArrayPtr<const_unsigned_char> other)

{
  size_t sVar1;
  ulong uVar2;
  ArrayPtr<const_unsigned_char> other_00;
  bool bVar3;
  size_t sVar4;
  uchar *puVar5;
  uchar *puVar6;
  ulong local_50;
  size_t i;
  size_t s;
  uchar *src;
  uchar *dst;
  ArrayPtr<unsigned_char> *this_local;
  ArrayPtr<const_unsigned_char> other_local;
  
  other_local.ptr = (uchar *)other.size_;
  this_local = (ArrayPtr<unsigned_char> *)other.ptr;
  sVar1 = this->size_;
  sVar4 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
  if (sVar1 != sVar4) {
    kj::_::inlineRequireFailure
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common.h"
               ,0x7db,"size_ == other.size()","\"copy requires arrays of the same size\"",
               "copy requires arrays of the same size");
  }
  other_00.size_ = (size_t)other_local.ptr;
  other_00.ptr = (uchar *)this_local;
  bVar3 = intersects(this,other_00);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    kj::_::inlineRequireFailure
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common.h"
               ,0x7dc,"!intersects(other)","\"copy memory area must not overlap\"",
               "copy memory area must not overlap");
  }
  puVar5 = begin(this);
  puVar6 = ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&this_local);
  uVar2 = this->size_;
  for (local_50 = 0; local_50 < uVar2; local_50 = local_50 + 1) {
    puVar5[local_50] = puVar6[local_50];
  }
  return;
}

Assistant:

inline void copyFrom(kj::ArrayPtr<const T> other) {
    // Copy data from the other array pointer.
    // Arrays have to be of the same size and memory area MUST NOT overlap.
    KJ_IREQUIRE(size_ == other.size(), "copy requires arrays of the same size");
    KJ_IREQUIRE(!intersects(other), "copy memory area must not overlap");
    T* __restrict__ dst = begin();
    const T* __restrict__ src = other.begin();
    for (size_t s = size_, i = 0; i < s; i++) { dst[i] = src[i]; }
  }